

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-misc.c
# Opt level: O0

void do_cmd_reshape(command *cmd)

{
  _Bool _Var1;
  wchar_t subtype;
  char *prompt;
  source sVar2;
  source origin;
  char *local_38;
  char *shape_name;
  command *pcStack_10;
  _Bool ident;
  command *cmd_local;
  
  pcStack_10 = cmd;
  _Var1 = player_is_shapechanged(player);
  if ((_Var1) ||
     (_Var1 = flag_has_dbg((player->state).pflags,10,0x14,"player->state.pflags","(PF_BEARSKIN)"),
     _Var1)) {
    _Var1 = player_is_shapechanged(player);
    if (_Var1) {
      _Var1 = get_check("Change back to your original form? ");
      if (_Var1) {
        player_resume_normal_shape(player);
      }
    }
    else {
      if (player->lev < 0x14) {
        local_38 = "bear cub";
      }
      else {
        local_38 = "great bear";
        if (player->lev < 0x28) {
          local_38 = "bear";
        }
      }
      prompt = format("Assume the form of a %s? ",local_38);
      _Var1 = get_check(prompt);
      if (_Var1) {
        sVar2 = source_none();
        origin.which = sVar2.which;
        subtype = shape_name_to_idx(local_38);
        origin._4_4_ = 0;
        origin.what = sVar2.what;
        effect_simple(L'k',origin,"0",subtype,L'\0',L'\0',L'\0',L'\0',
                      (_Bool *)((long)&shape_name + 7));
        player->upkeep->energy_use = (uint)z_info->move_energy;
      }
    }
  }
  return;
}

Assistant:

void do_cmd_reshape(struct command *cmd)
{
	/* Sanity */
	if (!(player_is_shapechanged(player) || player_has(player, PF_BEARSKIN))) {
		return;
	}

	/* Change back or change */
	if (player_is_shapechanged(player)) {
		if (get_check("Change back to your original form? " )) {
			player_resume_normal_shape(player);
		}
		return;
	} else {
		bool ident;
		const char *shape_name = (player->lev < 20) ? "bear cub" :
			((player->lev < 40) ? "bear" : "great bear");

		/* Confirm */
		if (!get_check(format("Assume the form of a %s? ", shape_name)))
			return;

		/* Change */
		effect_simple(EF_SHAPECHANGE, source_none(), "0",
					  shape_name_to_idx(shape_name), 0, 0, 0, 0, &ident);

		/* Use some energy */
		player->upkeep->energy_use = z_info->move_energy;
	}
}